

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_write_indent(yaml_emitter_t *emitter)

{
  yaml_break_t yVar1;
  yaml_char_t yVar2;
  int iVar3;
  yaml_char_t *pyVar4;
  int iVar5;
  
  iVar5 = 0;
  if (0 < emitter->indent) {
    iVar5 = emitter->indent;
  }
  if (emitter->indention == 0) {
LAB_00108552:
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) {
      return 0;
    }
    yVar1 = emitter->line_break;
    if (yVar1 == YAML_CR_BREAK) {
      yVar2 = '\r';
LAB_001085a9:
      pyVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar4 + 1;
      *pyVar4 = yVar2;
    }
    else {
      if (yVar1 == YAML_CRLN_BREAK) {
        pyVar4 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar4 + 1;
        *pyVar4 = '\r';
LAB_001085a3:
        yVar2 = '\n';
        goto LAB_001085a9;
      }
      if (yVar1 == YAML_LN_BREAK) goto LAB_001085a3;
    }
    emitter->column = 0;
    emitter->line = emitter->line + 1;
    iVar3 = 0;
  }
  else {
    iVar3 = emitter->column;
    if (iVar5 < iVar3) goto LAB_00108552;
    if (iVar3 == iVar5) {
      if (emitter->whitespace != 0) goto LAB_00108606;
      goto LAB_00108552;
    }
  }
  while (iVar3 < iVar5) {
    pyVar4 = (emitter->buffer).pointer;
    if ((emitter->buffer).end <= pyVar4 + 5) {
      iVar3 = yaml_emitter_flush(emitter);
      if (iVar3 == 0) {
        return 0;
      }
      pyVar4 = (emitter->buffer).pointer;
    }
    (emitter->buffer).pointer = pyVar4 + 1;
    *pyVar4 = ' ';
    iVar3 = emitter->column + 1;
    emitter->column = iVar3;
  }
LAB_00108606:
  emitter->whitespace = 1;
  emitter->indention = 1;
  return 1;
}

Assistant:

static int
yaml_emitter_write_indent(yaml_emitter_t *emitter)
{
    int indent = (emitter->indent >= 0) ? emitter->indent : 0;

    if (!emitter->indention || emitter->column > indent
            || (emitter->column == indent && !emitter->whitespace)) {
        if (!PUT_BREAK(emitter)) return 0;
    }

    while (emitter->column < indent) {
        if (!PUT(emitter, ' ')) return 0;
    }

    emitter->whitespace = 1;
    emitter->indention = 1;

    return 1;
}